

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenRefEq(BinaryenModuleRef module,BinaryenExpressionRef left,BinaryenExpressionRef right)

{
  RefEq *pRVar1;
  Builder local_10;
  
  local_10.wasm = module;
  pRVar1 = wasm::Builder::makeRefEq(&local_10,left,right);
  return (BinaryenExpressionRef)pRVar1;
}

Assistant:

BinaryenExpressionRef BinaryenRefEq(BinaryenModuleRef module,
                                    BinaryenExpressionRef left,
                                    BinaryenExpressionRef right) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeRefEq((Expression*)left, (Expression*)right));
}